

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

char * merge(char *a,char *b,_func_int_char_ptr_char_ptr *cmp,int offset)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (b != (char *)0x0) {
    iVar1 = (*cmp)(a,b);
    if (iVar1 < 1) {
      pcVar3 = *(char **)(a + offset);
      pcVar2 = a;
    }
    else {
      pcVar2 = b;
      pcVar3 = a;
      a = b;
      b = *(char **)(b + offset);
    }
    while ((pcVar3 != (char *)0x0 && (b != (char *)0x0))) {
      iVar1 = (*cmp)(pcVar3,b);
      if (iVar1 < 1) {
        *(char **)(pcVar2 + offset) = pcVar3;
        pcVar2 = pcVar3;
        pcVar3 = *(char **)(pcVar3 + offset);
      }
      else {
        *(char **)(pcVar2 + offset) = b;
        pcVar2 = b;
        b = *(char **)(b + offset);
      }
    }
    if (pcVar3 != (char *)0x0) {
      b = pcVar3;
    }
    *(char **)(pcVar2 + offset) = b;
  }
  return a;
}

Assistant:

static char *merge(
  char *a,
  char *b,
  int (*cmp)(const char*,const char*),
  int offset
){
  char *ptr, *head;

  if( a==0 ){
    head = b;
  }else if( b==0 ){
    head = a;
  }else{
    if( (*cmp)(a,b)<=0 ){
      ptr = a;
      a = NEXT(a);
    }else{
      ptr = b;
      b = NEXT(b);
    }
    head = ptr;
    while( a && b ){
      if( (*cmp)(a,b)<=0 ){
        NEXT(ptr) = a;
        ptr = a;
        a = NEXT(a);
      }else{
        NEXT(ptr) = b;
        ptr = b;
        b = NEXT(b);
      }
    }
    if( a ) NEXT(ptr) = a;
    else    NEXT(ptr) = b;
  }
  return head;
}